

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibrary.cpp
# Opt level: O1

PropertyName * __thiscall
Jinx::Impl::Library::GetPropertyName
          (PropertyName *__return_storage_ptr__,Library *this,String *name)

{
  RuntimeID RVar1;
  int iVar2;
  iterator iVar3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_propertyMutex);
  if (iVar2 == 0) {
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>,_4096UL,_16UL>_>
            ::find(&(this->m_propertyNameTable)._M_t,name);
    if ((_Rb_tree_header *)iVar3._M_node ==
        &(this->m_propertyNameTable)._M_t._M_impl.super__Rb_tree_header) {
      PropertyName::PropertyName(__return_storage_ptr__);
    }
    else {
      RVar1 = *(RuntimeID *)(iVar3._M_node + 2);
      *(undefined8 *)((long)&__return_storage_ptr__->m_id + 5) =
           *(undefined8 *)&iVar3._M_node[2].field_0x5;
      __return_storage_ptr__->m_id = RVar1;
      (__return_storage_ptr__->m_name)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_name).field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
      _M_construct<char*>((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)
                          &__return_storage_ptr__->m_name,iVar3._M_node[2]._M_left,
                          (long)&(iVar3._M_node[2]._M_left)->_M_color +
                          (long)&(iVar3._M_node[2]._M_right)->_M_color);
      Variant::Variant(&__return_storage_ptr__->m_defaultValue,(Variant *)&iVar3._M_node[3]._M_left)
      ;
      __return_storage_ptr__->m_partCount = (size_t)iVar3._M_node[4]._M_right;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_propertyMutex);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

inline_t PropertyName Library::GetPropertyName(const String & name)
	{
		std::lock_guard<std::mutex> lock(m_propertyMutex);
		auto itr = m_propertyNameTable.find(name);
		if (itr == m_propertyNameTable.end())
			return PropertyName();
		return itr->second;
	}